

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_global(Context *ctx,RegisterType regtype,int regnum)

{
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  size_t in_R8;
  char varname [64];
  char regnum_str [16];
  char acStack_78 [64];
  char local_38 [24];
  
  pcVar2 = get_D3D_register_string(ctx,regtype,regnum,local_38,in_R8);
  snprintf(acStack_78,0x40,"%s_%s%s",ctx->shader_type_str,pcVar2,local_38);
  push_output(ctx,&ctx->globals);
  if ((int)regtype < 0xf) {
    if (regtype == REG_TYPE_TEMP) {
      pcVar2 = "vec4 %s;";
    }
    else {
      if (regtype != REG_TYPE_ADDRESS) goto LAB_0010a65e;
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        bVar3 = 0;
        if (ctx->minor_ver != 0xff) {
          bVar3 = ctx->minor_ver;
        }
        if (((uint)bVar3 | (uint)ctx->major_ver << 0x10) < 0x10004) {
          if (ctx->profile_supports_glsles == 0) {
            pcVar2 = "vec4 %s = gl_TexCoord[%d];";
          }
          else {
            pcVar2 = "vec4 %s = v_TexCoord[%d];";
          }
          output_line(ctx,pcVar2,acStack_78,(ulong)(uint)regnum);
        }
        goto LAB_0010a676;
      }
      if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) goto LAB_0010a676;
      pcVar2 = "ivec4 %s;";
    }
  }
  else {
    if ((regtype == REG_TYPE_LOOP) || (regtype == REG_TYPE_LABEL)) goto LAB_0010a676;
    if (regtype != REG_TYPE_MAX) {
LAB_0010a65e:
      failf(ctx,"%s","BUG: we used a register we don\'t know how to define.");
      goto LAB_0010a676;
    }
    pcVar2 = "bvec4 %s;";
  }
  output_line(ctx,pcVar2,acStack_78);
LAB_0010a676:
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_global(Context *ctx, RegisterType regtype, int regnum)
{
    char varname[64];
    get_GLSL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);
    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_vertex(ctx))
                output_line(ctx, "ivec4 %s;", varname);
            else if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        output_line(ctx, "vec4 %s = v_TexCoord[%d];",
                                    varname, regnum);
                    else
#endif
                    output_line(ctx, "vec4 %s = gl_TexCoord[%d];",
                                varname, regnum);
                } // if
            } // else if
            break;
        case REG_TYPE_PREDICATE:
            output_line(ctx, "bvec4 %s;", varname);
            break;
        case REG_TYPE_TEMP:
            output_line(ctx, "vec4 %s;", varname);
            break;
        case REG_TYPE_LOOP:
            break; // no-op. We declare these in for loops at the moment.
        case REG_TYPE_LABEL:
            break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch
    pop_output(ctx);
}